

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimes.cxx
# Opt level: O0

bool __thiscall cmFileTimes::Load(cmFileTimes *this,string *fileName)

{
  bool bVar1;
  int iVar2;
  char *__file;
  pointer pTVar3;
  undefined1 local_d0 [8];
  stat st;
  unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_> local_28;
  unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_> ptr;
  string *fileName_local;
  cmFileTimes *this_local;
  
  ptr._M_t.super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>._M_t.
  super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>.
  super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>,_true,_true>)
       (__uniq_ptr_data<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>,_true,_true>)
       fileName;
  std::unique_ptr<cmFileTimes::Times,std::default_delete<cmFileTimes::Times>>::
  unique_ptr<std::default_delete<cmFileTimes::Times>,void>
            ((unique_ptr<cmFileTimes::Times,std::default_delete<cmFileTimes::Times>> *)&local_28);
  bVar1 = IsValid(this);
  if (bVar1) {
    std::unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>::swap
              (&local_28,&this->times);
  }
  else {
    std::make_unique<cmFileTimes::Times>();
    std::unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>::operator=
              (&local_28,
               (unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_> *)
               (st.__glibc_reserved + 2));
    std::unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>::~unique_ptr
              ((unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_> *)
               (st.__glibc_reserved + 2));
  }
  __file = (char *)std::__cxx11::string::c_str();
  iVar2 = stat(__file,(stat *)local_d0);
  if (-1 < iVar2) {
    pTVar3 = std::unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>::
             operator->(&local_28);
    (pTVar3->timeBuf).actime = st.st_blocks;
    pTVar3 = std::unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>::
             operator->(&local_28);
    (pTVar3->timeBuf).modtime = st.st_atim.tv_nsec;
    std::unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>::operator=
              (&this->times,&local_28);
  }
  std::unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>::~unique_ptr
            (&local_28);
  return -1 < iVar2;
}

Assistant:

bool cmFileTimes::Load(std::string const& fileName)
{
  std::unique_ptr<Times> ptr;
  if (this->IsValid()) {
    // Invalidate this and re-use times
    ptr.swap(this->times);
  } else {
    ptr = cm::make_unique<Times>();
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  cmFileTimes::WindowsHandle handle =
    CreateFileW(cmSystemTools::ConvertToWindowsExtendedPath(fileName).c_str(),
                GENERIC_READ, FILE_SHARE_READ, 0, OPEN_EXISTING,
                FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!handle) {
    return false;
  }
  if (!GetFileTime(handle, &ptr->timeCreation, &ptr->timeLastAccess,
                   &ptr->timeLastWrite)) {
    return false;
  }
#else
  struct stat st;
  if (stat(fileName.c_str(), &st) < 0) {
    return false;
  }
  ptr->timeBuf.actime = st.st_atime;
  ptr->timeBuf.modtime = st.st_mtime;
#endif
  // Accept times
  this->times = std::move(ptr);
  return true;
}